

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall cfd::js::api::json::Base64Data::Base64Data(Base64Data *this)

{
  allocator local_11;
  Base64Data *local_10;
  Base64Data *this_local;
  
  local_10 = this;
  core::JsonClassBase<cfd::js::api::json::Base64Data>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::Base64Data>);
  (this->super_JsonClassBase<cfd::js::api::json::Base64Data>)._vptr_JsonClassBase =
       (_func_int **)&PTR__Base64Data_01b3dda0;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->base64_,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  CollectFieldName();
  return;
}

Assistant:

Base64Data() {
    CollectFieldName();
  }